

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PushPopTest.cpp
# Opt level: O1

void __thiscall
PushPopTest_FifoOrder_Test::~PushPopTest_FifoOrder_Test(PushPopTest_FifoOrder_Test *this)

{
  (this->super_PushPopTest).super_TestWithParam<unsigned_long>.super_Test._vptr_Test =
       (_func_int **)&PTR__PushPopTest_00162c78;
  (this->super_PushPopTest).super_TestWithParam<unsigned_long>.
  super_WithParamInterface<unsigned_long>._vptr_WithParamInterface = (_func_int **)&DAT_00162cb8;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&(this->super_PushPopTest).stdDeque.super__Deque_base<int,_std::allocator<int>_>);
  Deque<int,_std::allocator<int>_>::~Deque(&(this->super_PushPopTest).myDeque);
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_P(PushPopTest, FifoOrder) {
    std::size_t n = GetParam();
    for (std::size_t i = 0; i < n; ++i) {
        int x = nextRandom();
        myDeque.push_back(x);
        stdDeque.push_back(x);
    }

    ASSERT_EQ(myDeque.size(), stdDeque.size());

    auto p = std::mismatch(myDeque.begin(), myDeque.end(), stdDeque.begin());
    ASSERT_EQ(p.first, myDeque.end());

    while (!stdDeque.empty()) {
        int s = stdDeque.front();
        int m = myDeque.front();
        ASSERT_EQ(s, m);
        stdDeque.pop_front();
        myDeque.pop_front();
    }
}